

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_graph.cpp
# Opt level: O0

shared_ptr<HawkTracer::client::CallGraph::TreeNode> __thiscall
HawkTracer::client::CallGraph::_add_new_call
          (CallGraph *this,NodeData *node_data,
          shared_ptr<HawkTracer::client::CallGraph::TreeNode> *parent,
          vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
          *calls)

{
  bool bVar1;
  HT_DurationNs HVar2;
  pointer ppVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>
  *in_R8;
  shared_ptr<HawkTracer::client::CallGraph::TreeNode> sVar5;
  int local_94;
  undefined1 local_8d;
  undefined4 local_8c;
  __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
  local_88 [3];
  string *local_70;
  pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> *local_68;
  __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
  local_60;
  __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
  local_58;
  __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
  call;
  string label;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  *calls_local;
  shared_ptr<HawkTracer::client::CallGraph::TreeNode> *parent_local;
  NodeData *node_data_local;
  CallGraph *this_local;
  shared_ptr<HawkTracer::client::CallGraph::TreeNode> *event_node;
  
  std::__cxx11::string::string((string *)&call,(string *)parent);
  local_60._M_current =
       (pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> *)
       std::
       vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
       ::begin((vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                *)in_R8);
  local_68 = (pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> *)
             std::
             vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
             ::end((vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                    *)in_R8);
  local_70 = (string *)&call;
  local_58 = std::
             find_if<__gnu_cxx::__normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>*,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>>,HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                       (local_60,(__normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
                                  )local_68,(string *)&call);
  local_88[0]._M_current =
       (pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> *)
       std::
       vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
       ::end((vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
              *)in_R8);
  bVar1 = __gnu_cxx::operator!=(&local_58,local_88);
  if (bVar1) {
    HVar2 = NodeData::get_duration((NodeData *)parent);
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
             ::operator->(&local_58);
    peVar4 = std::
             __shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ppVar3);
    peVar4->total_duration = peVar4->total_duration + HVar2;
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
             ::operator->(&local_58);
    peVar4 = std::
             __shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ppVar3);
    NodeData::operator=(&peVar4->data,(NodeData *)parent);
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
             ::operator->(&local_58);
    ppVar3->second = ppVar3->second + 1;
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
             ::operator->(&local_58);
    std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>::shared_ptr
              ((shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)this,&ppVar3->first);
  }
  else {
    local_8d = 0;
    std::
    make_shared<HawkTracer::client::CallGraph::TreeNode,HawkTracer::client::CallGraph::NodeData_const&>
              ((NodeData *)this);
    peVar4 = std::
             __shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::weak_ptr<HawkTracer::client::CallGraph::TreeNode>::operator=
              (&peVar4->parent,(shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)calls);
    local_94 = 1;
    std::
    vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>
    ::emplace_back<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>&,int>
              (in_R8,(shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)this,&local_94);
    local_8d = 1;
  }
  local_8c = 1;
  std::__cxx11::string::~string((string *)&call);
  sVar5.super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar5.super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<HawkTracer::client::CallGraph::TreeNode>)
         sVar5.
         super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CallGraph::TreeNode> CallGraph::_add_new_call(const NodeData& node_data,
                                                              const std::shared_ptr<TreeNode>& parent,
                                                              std::vector<std::pair<std::shared_ptr<TreeNode>, int>>& calls)
{
    std::string label = node_data.label;
    auto call = std::find_if(calls.begin(), calls.end(),
            [&label](const std::pair<std::shared_ptr<TreeNode>, int>& call) {
                return call.first->data.label == label;
            });
    if (call != calls.end())
    {
        call->first->total_duration += node_data.get_duration();
        call->first->data = node_data;
        ++call->second;

        return call->first;
    }
    else
    {
        std::shared_ptr<TreeNode> event_node = std::make_shared<TreeNode>(node_data);
        event_node->parent = parent;
        calls.emplace_back(event_node, 1);

        return event_node;
    }
}